

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bias_x86.cpp
# Opt level: O3

int __thiscall ncnn::Bias_x86::forward_inplace(Bias_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  int iVar2;
  long lVar3;
  uint uVar4;
  long lVar5;
  float *pfVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  
  iVar2 = bottom_top_blob->c;
  if (0 < (long)iVar2) {
    uVar4 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d;
    lVar3 = *(long *)(&this->field_0xd8 + (long)this->_vptr_Bias_x86[-3]);
    lVar5 = 0;
    do {
      pfVar6 = (float *)(bottom_top_blob->cstep * lVar5 * bottom_top_blob->elemsize +
                        (long)bottom_top_blob->data);
      fVar1 = *(float *)(lVar3 + lVar5 * 4);
      if ((int)uVar4 < 4) {
        uVar8 = 0;
      }
      else {
        iVar7 = 3;
        do {
          *pfVar6 = *pfVar6 + fVar1;
          pfVar6[1] = pfVar6[1] + fVar1;
          pfVar6[2] = pfVar6[2] + fVar1;
          pfVar6[3] = pfVar6[3] + fVar1;
          pfVar6 = pfVar6 + 4;
          iVar7 = iVar7 + 4;
          uVar8 = uVar4 & 0xfffffffc;
        } while (iVar7 < (int)uVar4);
      }
      if (uVar4 - uVar8 != 0 && (int)uVar8 <= (int)uVar4) {
        lVar9 = 0;
        do {
          pfVar6[lVar9] = pfVar6[lVar9] + fVar1;
          lVar9 = lVar9 + 1;
        } while (uVar4 - uVar8 != (int)lVar9);
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != iVar2);
  }
  return 0;
}

Assistant:

int Bias_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int size = w * h * d;

    const float* bias_ptr = bias_data;
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        float bias = bias_ptr[q];

        int i = 0;
#if __SSE2__
#if __AVX__
        {
            __m256 _bias256 = _mm256_set1_ps(bias);
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _outp = _mm256_add_ps(_p, _bias256);
                _mm256_storeu_ps(ptr, _outp);

                ptr += 8;
            }
        }
#endif // __AVX__
        {
            __m128 _bias = _mm_set1_ps(bias);
            for (; i + 3 < size; i += 4)
            {
                __m128 _p = _mm_loadu_ps(ptr);
                __m128 _outp = _mm_add_ps(_p, _bias);
                _mm_storeu_ps(ptr, _outp);

                ptr += 4;
            }
        }
#endif // __SSE2__

        for (; i < size; i++)
        {
            *ptr = *ptr + bias;

            ptr++;
        }
    }

    return 0;
}